

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l1_full.c
# Opt level: O2

int picnic_l1_full_write_private_key(picnic_l1_full_privatekey_t *key,uint8_t *buf,size_t buflen)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  if (buflen < 0x34 || (buf == (uint8_t *)0x0 || key == (picnic_l1_full_privatekey_t *)0x0)) {
    return -1;
  }
  *buf = '\n';
  uVar1 = *(undefined8 *)(key->data + 8);
  uVar2 = *(undefined8 *)(key->data + 0x10);
  uVar3 = *(undefined8 *)(key->data + 0x18);
  uVar4 = *(undefined8 *)(key->data + 0x13);
  uVar5 = *(undefined8 *)(key->data + 0x1b);
  uVar6 = *(undefined8 *)(key->data + 0x23);
  uVar7 = *(undefined8 *)(key->data + 0x2b);
  *(undefined8 *)(buf + 1) = *(undefined8 *)key->data;
  *(undefined8 *)(buf + 9) = uVar1;
  *(undefined8 *)(buf + 0x11) = uVar2;
  *(undefined8 *)(buf + 0x19) = uVar3;
  *(undefined8 *)(buf + 0x14) = uVar4;
  *(undefined8 *)(buf + 0x1c) = uVar5;
  *(undefined8 *)(buf + 0x24) = uVar6;
  *(undefined8 *)(buf + 0x2c) = uVar7;
  return 0x34;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l1_full_write_private_key(const picnic_l1_full_privatekey_t* key,
                                                             uint8_t* buf, size_t buflen) {
  if (!key || !buf) {
    return -1;
  }

  if (buflen < PRIVATE_KEY_SIZE) {
    return -1;
  }

  buf[0] = PARAM;
  memcpy(buf + 1, &key->data, PRIVATE_KEY_SIZE - 1);
  return PRIVATE_KEY_SIZE;
}